

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarExpandedReader.cpp
# Opt level: O1

Pair * ZXing::OneD::ReadPair(Pair *__return_storage_ptr__,PatternView *view,Direction dir)

{
  Iterator puVar1;
  int iVar2;
  Character CVar3;
  Character CVar4;
  int *piVar5;
  Iterator puVar6;
  Iterator puVar7;
  uint uVar8;
  ushort uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  PatternView *pattern;
  int i;
  ulong uVar13;
  float fVar14;
  short sVar16;
  short sVar17;
  short sVar18;
  undefined1 auVar15 [16];
  short sVar20;
  short sVar21;
  undefined1 auVar19 [16];
  int finder;
  float bestVariance;
  uint local_c8;
  float local_c4;
  PatternView *local_c0;
  PatternView local_b8;
  undefined8 uStack_98;
  undefined4 uStack_90;
  undefined4 local_8c;
  undefined4 uStack_88;
  undefined8 uStack_84;
  PatternView local_78;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  puVar1 = view->_data;
  uStack_88 = 0x10002;
  uStack_84 = 0x2000200090001;
  uStack_98 = 0x3000200080001;
  uStack_90 = 0x10001;
  local_8c = 0x60005;
  local_b8._base = (Iterator)0x1000100030006;
  local_b8._end = (Iterator)0x1000300040006;
  local_b8._data = (Iterator)0x8000400010001;
  local_b8._8_8_ = 0x4000100010001;
  local_78._data = (Iterator)0x1000400080001;
  local_78._8_8_ = 0x4000600030001;
  local_78._base = (Iterator)0x4000300010001;
  local_78._end = (Iterator)0x3000100010006;
  local_58 = 0x1000100080002;
  uStack_50 = 0x60002;
  uStack_4c = 0x10005;
  uStack_48 = 0x20001;
  uStack_44 = 0x1000100090002;
  pattern = &local_78;
  if (dir == Left) {
    pattern = &local_b8;
  }
  uVar12 = 0xffffffff;
  local_c4 = 0.2;
  uVar13 = 0;
  local_c0 = view;
  do {
    fVar14 = RowReader::PatternMatchVariance<unsigned_short,unsigned_short>
                       (puVar1 + 8,(unsigned_short *)pattern,5,0.45);
    if (local_c4 <= fVar14) {
      if ((fVar14 == local_c4) && (!NAN(fVar14) && !NAN(local_c4))) {
        uVar12 = 0xffffffff;
      }
    }
    else {
      if (local_c4 <= fVar14) {
        fVar14 = local_c4;
      }
      uVar12 = uVar13 & 0xffffffff;
      local_c4 = fVar14;
    }
    uVar13 = uVar13 + 1;
    pattern = (PatternView *)((long)&pattern->_size + 2);
  } while (uVar13 != 6);
  local_c8 = ~(uint)uVar12;
  if (dir != Left) {
    local_c8 = (uint)uVar12 + 1;
  }
  if (local_c8 == 0) goto LAB_001623e3;
  local_b8._data = local_c0->_data;
  local_b8._size = 8;
  local_b8._base = local_c0->_base;
  local_b8._end = local_c0->_end;
  CVar3 = ReadDataCharacter(&local_b8,local_c8,false);
  if ((CVar3.value == -1) || (0x114d < CVar3.value + 0x1a5U && local_c8 == 1)) goto LAB_001623e3;
  puVar1 = local_c0->_data;
  uVar11 = 0xffffffff;
  if (local_c0->_end < puVar1 + 0x15 || puVar1 + 0xd < local_c0->_base) {
LAB_00162345:
    uVar12 = 0;
  }
  else {
    lVar10 = -10;
    uVar9 = 0;
    do {
      uVar9 = uVar9 + *(short *)((long)puVar1 + lVar10 + 0x1a);
      lVar10 = lVar10 + 2;
    } while (lVar10 != 0);
    sVar20 = puVar1[0x13] + puVar1[0xf];
    sVar21 = puVar1[0x14] + puVar1[0x10];
    sVar16 = sVar21 + puVar1[0x12] + puVar1[0xe];
    sVar17 = sVar21 + puVar1[0x12] * 2;
    sVar18 = sVar21 + puVar1[0x14] * 2;
    auVar19._0_2_ = sVar16 + sVar20 + puVar1[0x11] + puVar1[0xd];
    auVar19._2_2_ = sVar16;
    auVar19._4_2_ = 0;
    auVar19._6_2_ = sVar21 * 2;
    auVar19._8_2_ = sVar17 + sVar20 + puVar1[0x11] * 2;
    auVar19._10_2_ = sVar17;
    auVar19._12_2_ = sVar18 + sVar20 + puVar1[0x13] * 2;
    auVar19._14_2_ = sVar18;
    auVar19 = auVar19 & _DAT_00198970;
    uVar12 = auVar19._0_8_ & 0xffff0000ffffffff;
    auVar15._0_4_ = (float)(int)uVar12;
    auVar15._4_4_ = (float)(int)((uint)(uVar12 >> 0x20) | (uint)uVar9);
    auVar15._8_4_ = (float)auVar19._8_4_;
    auVar15._12_4_ = (float)auVar19._12_4_;
    auVar15 = divps(auVar15,_DAT_00198c10);
    if (0.1 <= ABS(auVar15._0_4_ / auVar15._4_4_ + -1.0)) goto LAB_00162345;
    local_b8._size = 8;
    local_b8._data = puVar1 + 0xd;
    local_b8._base = local_c0->_base;
    local_b8._end = local_c0->_end;
    CVar4 = ReadDataCharacter(&local_b8,local_c8,true);
    uVar11 = CVar4.value;
    uVar12 = (ulong)CVar4 & 0xffffffff00000000;
  }
  if ((uVar11 != 0xffffffff) ||
     (piVar5 = std::__find_if<int_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                         (VALID_HALF_PAIRS,
                          ParseFinderPattern(ZXing::PatternView_const&,ZXing::OneD::Direction)::
                          FINDER_PATTERNS,&local_c8),
     piVar5 != (int *)ParseFinderPattern(ZXing::PatternView_const&,ZXing::OneD::Direction)::
                      FINDER_PATTERNS)) {
    __return_storage_ptr__->left = CVar3;
    __return_storage_ptr__->right = (Character)(uVar12 | uVar11);
    __return_storage_ptr__->finder = local_c8;
    puVar1 = local_c0->_data;
    puVar6 = local_c0->_base;
    uVar9 = 0;
    uVar8 = 0;
    puVar7 = puVar6;
    if (puVar6 != puVar1) {
      do {
        uVar9 = uVar9 + *puVar7;
        puVar7 = puVar7 + 1;
      } while (puVar7 != puVar1);
      uVar8 = (uint)uVar9;
    }
    __return_storage_ptr__->xStart = uVar8;
    puVar7 = puVar1 + 8;
    if (uVar11 != 0xffffffff) {
      puVar7 = puVar1 + 0xd;
    }
    puVar7 = (Iterator)((long)puVar7 + (ulong)((uint)(uVar11 != 0xffffffff) * 6) + 10);
    if (puVar6 == puVar7) {
      iVar2 = -1;
    }
    else {
      uVar9 = 0;
      do {
        uVar9 = uVar9 + *puVar6;
        puVar6 = puVar6 + 1;
      } while (puVar6 != puVar7);
      iVar2 = uVar9 - 1;
    }
    __return_storage_ptr__->xStop = iVar2;
    __return_storage_ptr__->y = -1;
    __return_storage_ptr__->count = 1;
    return __return_storage_ptr__;
  }
LAB_001623e3:
  (__return_storage_ptr__->left).value = -1;
  (__return_storage_ptr__->left).checksum = 0;
  (__return_storage_ptr__->right).value = -1;
  (__return_storage_ptr__->right).checksum = 0;
  __return_storage_ptr__->finder = 0;
  __return_storage_ptr__->xStart = -1;
  __return_storage_ptr__->xStop = 1;
  __return_storage_ptr__->y = -1;
  __return_storage_ptr__->count = 1;
  return __return_storage_ptr__;
}

Assistant:

static Pair ReadPair(const PatternView& view, Direction dir)
{
	if (int finder = ParseFinderPattern(Finder(view), dir))
		if (auto charL = ReadDataCharacter(LeftChar(view), finder, false))
			if (finder != FINDER_A || ChecksumIsValid(charL)) {
				auto charR = RightChar(view).isValid() && IsCharacter(RightChar(view), 17, ModSizeFinder(view))
								 ? ReadDataCharacter(RightChar(view), finder, true)
								 : Character();
				if (charR || Contains(VALID_HALF_PAIRS, finder))
					return {charL, charR, finder, view.pixelsInFront(),
							(charR ? RightChar(view) : Finder(view)).pixelsTillEnd()};
			}

	return {};
}